

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall Configuration::Configuration(Configuration *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  bool local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  is_any_ofF<char> local_80;
  char *local_68;
  char *pValue;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  Configuration *this_local;
  
  this->m_debug = false;
  this->m_verbose = false;
  local_10 = (undefined1  [8])this;
  std::__cxx11::string::string((string *)&this->m_baseURL);
  std::__cxx11::string::string((string *)&this->m_baseDir);
  std::__cxx11::string::string((string *)&this->m_username);
  std::__cxx11::string::string((string *)&this->m_password);
  this->m_segment_duration = 0;
  this->m_max_backlog_total_segment_duration = 300;
  pValue._3_1_ = 1;
  local_48 = &local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,".ts",&local_49);
  pValue._3_1_ = 0;
  local_20 = &local_40;
  local_18 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&pValue + 2));
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_extensions,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&pValue + 2));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&pValue + 2));
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_d0 = local_d0 + -1;
    std::__cxx11::string::~string((string *)local_d0);
  } while (local_d0 != &local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = getenv("CAMERA_DEBUG");
  if (local_68 != (char *)0x0) {
    sVar2 = strlen(local_68);
    local_e1 = true;
    if (sVar2 != 0) {
      iVar1 = strncasecmp(local_68,"true",4);
      local_e1 = true;
      if (iVar1 != 0) {
        lVar3 = strtol(local_68,(char **)0x0,0);
        local_e1 = lVar3 != 0;
      }
    }
    this->m_debug = local_e1;
  }
  local_68 = getenv("CAMERA_BASE_URL");
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->m_baseURL,local_68);
  }
  local_68 = getenv("CAMERA_BASE_DIR");
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->m_baseDir,local_68);
  }
  local_68 = getenv("CAMERA_USERNAME");
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->m_username,local_68);
  }
  local_68 = getenv("CAMERA_PASSWORD");
  if (local_68 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->m_password,local_68);
  }
  local_68 = getenv("CAMERA_SEGMENT_DURATION");
  if (local_68 != (char *)0x0) {
    sVar4 = strtoll(local_68,(char **)0x0,10);
    this->m_segment_duration = sVar4;
  }
  local_68 = getenv("CAMERA_MAX_BACKLOG_TOTAL_SEGMENT_DURATION");
  if (local_68 != (char *)0x0) {
    sVar4 = strtoll(local_68,(char **)0x0,10);
    this->m_max_backlog_total_segment_duration = sVar4;
  }
  if ((this->m_max_backlog_total_segment_duration != 0) &&
     (this->m_max_backlog_total_segment_duration < this->m_segment_duration)) {
    this->m_max_backlog_total_segment_duration = this->m_segment_duration;
  }
  local_68 = getenv("CAMERA_SEGMENT_EXTENSIONS");
  if (local_68 != (char *)0x0) {
    boost::algorithm::is_any_of<char[3]>(&local_80,(char (*) [3])" \t");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char*&,boost::algorithm::detail::is_any_ofF<char>>
              (&this->m_extensions,&local_68,&local_80,token_compress_on);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_80);
  }
  return;
}

Assistant:

Configuration::Configuration()
{
    char* pValue;

    if ((pValue = getenv("CAMERA_DEBUG")) != nullptr)
    {
        m_debug = strlen(pValue) == 0 || strncasecmp(pValue, "true", 4) == 0 || strtol(pValue, nullptr, 0) != 0;
    }

    if ((pValue = getenv("CAMERA_BASE_URL")) != nullptr)
    {
        m_baseURL = pValue;
    }

    if ((pValue = getenv("CAMERA_BASE_DIR")) != nullptr)
    {
        m_baseDir = pValue;
    }

    if ((pValue = getenv("CAMERA_USERNAME")) != nullptr)
    {
        m_username = pValue;
    }

    if ((pValue = getenv("CAMERA_PASSWORD")) != nullptr)
    {
        m_password = pValue;
    }

    if ((pValue = getenv("CAMERA_SEGMENT_DURATION")) != nullptr)
    {
        m_segment_duration = static_cast<size_t>(strtoll(pValue, nullptr, 10));
    }

    if ((pValue = getenv("CAMERA_MAX_BACKLOG_TOTAL_SEGMENT_DURATION")) != nullptr)
    {
        m_max_backlog_total_segment_duration = static_cast<size_t>(strtoll(pValue, nullptr, 10));
    }

    // It makes sense to keep at least one file around...
    if (m_max_backlog_total_segment_duration > 0 && m_max_backlog_total_segment_duration < m_segment_duration)
    {
        m_max_backlog_total_segment_duration = m_segment_duration;
    }

    if ((pValue = getenv("CAMERA_SEGMENT_EXTENSIONS")) != nullptr)
    {
        boost::algorithm::split(m_extensions, pValue, boost::algorithm::is_any_of(" \t"), boost::algorithm::token_compress_on);
    }
}